

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall
c4::yml::anon_unknown_0::_transform_tag(anon_unknown_0 *this,Tree *t,csubstr tag,size_t node)

{
  code *pcVar1;
  bool bVar2;
  size_t sz;
  size_t sVar3;
  char *pcVar4;
  ulong len_;
  substr sVar5;
  substr output;
  substr sVar6;
  csubstr cVar7;
  csubstr cVar8;
  csubstr tag_00;
  char msg [45];
  
  pcVar4 = tag.str;
  cVar7.len = (size_t)pcVar4;
  cVar7.str = (char *)t;
  sz = Tree::resolve_tag((Tree *)this,(substr)ZEXT816(0),cVar7,tag.len);
  if (sz != 0) {
    sVar5 = Tree::arena((Tree *)this);
    output = Tree::alloc_arena((Tree *)this,sz);
    sVar6 = Tree::arena((Tree *)this);
    if (sVar6.str != sVar5.str) {
      builtin_strncpy(msg + 0x20," prev_arena)",0xd);
      builtin_strncpy(msg + 0x10,"->arena().str ==",0x10);
      builtin_strncpy(msg,"check failed: (t",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          cVar7 = (csubstr)(*pcVar1)();
          return cVar7;
        }
      }
      pcVar1 = *(code **)(this + 0x58);
      to_csubstr(
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                );
      (*pcVar1)(msg,0x2d,*(undefined8 *)(this + 0x40));
    }
    tag_00.len = (size_t)pcVar4;
    tag_00.str = (char *)t;
    sVar3 = Tree::resolve_tag((Tree *)this,output,tag_00,tag.len);
    if (sz < sVar3) {
      builtin_strncpy(msg + 0x20,"quired_size)",0xd);
      builtin_strncpy(msg + 0x10,"ctual_size <= re",0x10);
      builtin_strncpy(msg,"check failed: (a",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          cVar7 = (csubstr)(*pcVar1)();
          return cVar7;
        }
      }
      pcVar1 = *(code **)(this + 0x58);
      to_csubstr(
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                );
      (*pcVar1)(msg,0x2d,*(undefined8 *)(this + 0x40));
    }
    if (sVar3 != 0xffffffffffffffff && output.len < sVar3) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          cVar7 = (csubstr)(*pcVar1)();
          return cVar7;
        }
      }
      handle_error(0x1e5106,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    len_ = output.len;
    if (sVar3 != 0xffffffffffffffff) {
      len_ = sVar3;
    }
    basic_substring<char>::basic_substring((basic_substring<char> *)msg,output.str,len_);
    pcVar4 = (char *)msg._8_8_;
    t = (Tree *)msg._0_8_;
  }
  cVar8.len = (size_t)pcVar4;
  cVar8.str = (char *)t;
  return cVar8;
}

Assistant:

csubstr _transform_tag(Tree *t, csubstr tag, size_t node)
{
    size_t required_size = t->resolve_tag(substr{}, tag, node);
    if(!required_size)
        return tag;
    const char *prev_arena = t->arena().str;
    substr buf = t->alloc_arena(required_size);
    _RYML_CB_ASSERT(t->m_callbacks, t->arena().str == prev_arena);
    size_t actual_size = t->resolve_tag(buf, tag, node);
    _RYML_CB_ASSERT(t->m_callbacks, actual_size <= required_size);
    return buf.first(actual_size);
}